

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

operation_t * op_get(int symbol,int ver)

{
  operation_t *local_20;
  operation_t *table;
  int ver_local;
  int symbol_local;
  
  local_20 = op_get_table(ver);
  if (local_20 != (operation_t *)0x0) {
    for (; local_20->symbol != 0; local_20 = local_20 + 1) {
      if (local_20->symbol == symbol) {
        return local_20;
      }
    }
  }
  return (operation_t *)0x0;
}

Assistant:

const operation_t*
op_get(
    int symbol,
    int ver
) {
    const operation_t* table = op_get_table(ver);
    if (table != NULL) {
        while(table->symbol) {
            if (table->symbol == symbol)
                return table;
            ++table;
        }
    }
    return NULL;
}